

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int prune_mode_by_skip_rd
              (AV1_COMP *cpi,MACROBLOCK *x,MACROBLOCKD *xd,BLOCK_SIZE bsize,int64_t ref_skip_rd,
              int mode_rate)

{
  int iVar1;
  int64_t best_skip_rd;
  BLOCK_SIZE in_CL;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  int64_t skip_rd;
  int64_t sse_y;
  MACROBLOCK *in_stack_00000010;
  int txfm_rd_gate_level;
  int eval_txfm;
  int iVar2;
  
  iVar2 = 1;
  iVar1 = get_txfm_rd_gate_level
                    ((uint)*(byte *)(*(long *)(in_RDI + 0x42008) + 0x3f),(int *)(in_RDI + 0x60a78),
                     in_CL,'\x02',0);
  if (iVar1 != 0) {
    best_skip_rd = compute_sse_plane(in_stack_00000010,(MACROBLOCKD *)sse_y,skip_rd._4_4_,
                                     skip_rd._3_1_);
    iVar2 = check_txfm_eval((MACROBLOCK *)CONCAT44(in_R9D,iVar2),(BLOCK_SIZE)((uint)iVar1 >> 0x18),
                            best_skip_rd,
                            ((long)in_R9D * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
                            best_skip_rd * 0x800,0,0x707522);
  }
  return iVar2;
}

Assistant:

static inline int prune_mode_by_skip_rd(const AV1_COMP *const cpi,
                                        MACROBLOCK *x, MACROBLOCKD *xd,
                                        const BLOCK_SIZE bsize,
                                        int64_t ref_skip_rd, int mode_rate) {
  int eval_txfm = 1;
  const int txfm_rd_gate_level =
      get_txfm_rd_gate_level(cpi->common.seq_params->enable_masked_compound,
                             cpi->sf.inter_sf.txfm_rd_gate_level, bsize,
                             TX_SEARCH_COMP_TYPE_MODE, /*eval_motion_mode=*/0);
  // Check if the mode is good enough based on skip rd
  if (txfm_rd_gate_level) {
    int64_t sse_y = compute_sse_plane(x, xd, PLANE_TYPE_Y, bsize);
    int64_t skip_rd = RDCOST(x->rdmult, mode_rate, (sse_y << 4));
    eval_txfm =
        check_txfm_eval(x, bsize, ref_skip_rd, skip_rd, txfm_rd_gate_level, 1);
  }
  return eval_txfm;
}